

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LatencyDecodingSynapse.cpp
# Opt level: O0

void __thiscall LatencyDecodingSynapse::update(LatencyDecodingSynapse *this)

{
  double dVar1;
  double dVar2;
  ValueEvent *this_00;
  long *plVar3;
  Scalar *pSVar4;
  reference ppEVar5;
  long in_RDI;
  double dVar6;
  double s0;
  int i;
  undefined4 in_stack_ffffffffffffffa8;
  int in_stack_ffffffffffffffac;
  DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffbc;
  int iVar7;
  Logging *in_stack_ffffffffffffffc0;
  int local_14;
  
  dVar1 = *(double *)(in_RDI + 0x38);
  dVar2 = **(double **)(in_RDI + 0x18);
  dVar6 = Clock::getCurrentTime(*(Clock **)(in_RDI + 0x40));
  if (dVar1 + dVar2 <= dVar6) {
    Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::setConstant
              ((DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)in_stack_ffffffffffffffc0,
               (Scalar *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
    *(double *)(in_RDI + 0x38) = **(double **)(in_RDI + 0x18) + *(double *)(in_RDI + 0x38);
  }
  for (local_14 = 0; local_14 < *(int *)(in_RDI + 0x30); local_14 = local_14 + 1) {
    pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                       (in_stack_ffffffffffffffb0,
                        CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
    if (*pSVar4 <= 0.0 && *pSVar4 != 0.0) {
      ppEVar5 = std::vector<Event_*,_std::allocator<Event_*>_>::operator[]
                          ((vector<Event_*,_std::allocator<Event_*>_> *)(*(long *)(in_RDI + 8) + 8),
                           (long)local_14);
      if ((*ppEVar5)->type == Spike) {
        ppEVar5 = std::vector<Event_*,_std::allocator<Event_*>_>::operator[]
                            ((vector<Event_*,_std::allocator<Event_*>_> *)
                             (*(long *)(in_RDI + 8) + 8),(long)local_14);
        in_stack_ffffffffffffffc0 =
             (Logging *)
             ((((*ppEVar5)->eventTime - *(double *)(in_RDI + 0x38)) / **(double **)(in_RDI + 0x18) -
              0.1) * 1.25);
        pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                           (in_stack_ffffffffffffffb0,
                            CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
        *pSVar4 = (Scalar)in_stack_ffffffffffffffc0;
        ppEVar5 = std::vector<Event_*,_std::allocator<Event_*>_>::operator[]
                            ((vector<Event_*,_std::allocator<Event_*>_> *)(in_RDI + 0x50),
                             (long)local_14);
        this_00 = (ValueEvent *)*ppEVar5;
        pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                           (in_stack_ffffffffffffffb0,
                            CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
        ValueEvent::setValue(this_00,*pSVar4);
      }
    }
    plVar3 = *(long **)(in_RDI + 0x10);
    in_stack_ffffffffffffffac = local_14;
    ppEVar5 = std::vector<Event_*,_std::allocator<Event_*>_>::operator[]
                        ((vector<Event_*,_std::allocator<Event_*>_> *)(in_RDI + 0x50),(long)local_14
                        );
    (**(code **)(*plVar3 + 0x28))(plVar3,in_stack_ffffffffffffffac,*ppEVar5);
    in_stack_ffffffffffffffb0 =
         *(DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> **)(in_RDI + 0x48);
    iVar7 = local_14;
    std::vector<Event_*,_std::allocator<Event_*>_>::operator[]
              ((vector<Event_*,_std::allocator<Event_*>_> *)(in_RDI + 0x50),(long)local_14);
    Logging::logValue(in_stack_ffffffffffffffc0,CONCAT44(iVar7,in_stack_ffffffffffffffb8),
                      (int)((ulong)in_stack_ffffffffffffffb0 >> 0x20),(int)in_stack_ffffffffffffffb0
                      ,(double)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
  }
  return;
}

Assistant:

void LatencyDecodingSynapse::update() {
    if(currentWindow + param->window_length_s <= clock->getCurrentTime()) {
        spikeTimes.setConstant(-1);
        currentWindow += param->window_length_s;
    }
    for(int i = 0; i < inputSize; i++) {
        if(spikeTimes(i) < 0 && from_population->output[i]->type == EventType::Spike) {      
            double s0 = from_population->output[i]->eventTime - currentWindow;
            s0 = s0/param->window_length_s;
            spikeTimes(i) = (s0 - 0.1) * 1.25;
            static_cast<ValueEvent*>(output[i])->setValue(spikeTimes(i));
            
        }
        to_population->setInput(i, output[i]);
        logger->logValue((long)this, i, EventType::Value, static_cast<ValueEvent*>(output[i])->value);
    }
}